

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O2

size_t __thiscall
andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
          (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this,size_t vertexIndex0,
          size_t vertexIndex1)

{
  size_t edgeIndex;
  pair<bool,_unsigned_long> pVar1;
  Edge<false,_unsigned_long> local_30;
  
  if (this->multipleEdgesEnabled_ != true) {
    pVar1 = findEdge(this,vertexIndex0,vertexIndex1);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return pVar1.second;
    }
  }
  local_30.vertexIndices_[0] = vertexIndex1;
  if (vertexIndex0 < vertexIndex1) {
    local_30.vertexIndices_[0] = vertexIndex0;
  }
  if (vertexIndex1 < vertexIndex0) {
    vertexIndex1 = vertexIndex0;
  }
  local_30.vertexIndices_[1] = vertexIndex1;
  std::
  vector<andres::graph::detail::Edge<false,unsigned_long>,std::allocator<andres::graph::detail::Edge<false,unsigned_long>>>
  ::emplace_back<andres::graph::detail::Edge<false,unsigned_long>>
            ((vector<andres::graph::detail::Edge<false,unsigned_long>,std::allocator<andres::graph::detail::Edge<false,unsigned_long>>>
              *)&this->edges_,&local_30);
  edgeIndex = ((long)(this->edges_).
                     super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->edges_).
                     super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
  insertAdjacenciesForEdge(this,edgeIndex);
  return edgeIndex;
}

Assistant:

inline std::size_t
Graph<VISITOR>::insertEdge(
    const std::size_t vertexIndex0,
    const std::size_t vertexIndex1
) {
    assert(vertexIndex0 < numberOfVertices()); 
    assert(vertexIndex1 < numberOfVertices()); 
    
    if(multipleEdgesEnabled()) {
insertEdgeMark:
        edges_.push_back(Edge(vertexIndex0, vertexIndex1));
        std::size_t edgeIndex = edges_.size() - 1;
        insertAdjacenciesForEdge(edgeIndex);
        visitor_.insertEdge(edgeIndex);  
        return edgeIndex;
    }
    else {
        std::pair<bool, std::size_t> p = findEdge(vertexIndex0, vertexIndex1);
        if(p.first) { // edge already exists
            return p.second;
        }
        else {
            goto insertEdgeMark;
        }
    }
}